

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ExternalCommand::execute
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  bool bVar1;
  reference ppBVar2;
  BuildValue *__args;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  reference ppBVar3;
  char *__n;
  iterator pcVar4;
  FileSystem *pFVar5;
  BuildSystemDelegate *pBVar6;
  Style style;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  StringRef path;
  StringRef path_00;
  value_type local_278;
  anon_class_64_4_ecb37c5b local_258;
  function<void_(llbuild::basic::ProcessResult)> local_218;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_1f8;
  char *local_1d0;
  char *local_1c8;
  string local_1c0;
  path *local_1a0;
  char *local_198;
  StringRef local_190;
  char *local_180;
  StringRef local_170;
  StringRef local_160;
  undefined1 local_150 [8];
  StringRef parent;
  BuildNode *node;
  iterator __end1;
  iterator __begin1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range1;
  undefined1 local_108 [8];
  BuildValue result;
  undefined8 local_90;
  ResultFn *resultFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  ExternalCommand *this_local;
  TaskInterface ti_local;
  int local_c;
  
  pcVar7 = (char *)ti.ctx;
  pcVar9 = (char *)ti.impl;
  pcVar8 = pcVar7;
  bVar1 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue(&this->skipValue);
  if (bVar1) {
    bVar1 = llvm::SmallVectorBase::empty((SmallVectorBase *)&this->missingInputKeys);
    if (!bVar1) {
      pBVar6 = BuildSystem::getDelegate(system);
      bVar1 = std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::empty(&(this->super_Command).outputs);
      if (bVar1) {
        local_278 = (value_type)0x0;
      }
      else {
        ppBVar2 = std::
                  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                  ::operator[](&(this->super_Command).outputs,0);
        local_278 = *ppBVar2;
      }
      llvm::ArrayRef<llbuild::buildsystem::BuildKey>::ArrayRef<void>
                ((ArrayRef<llbuild::buildsystem::BuildKey> *)&result.stringValues.size,
                 (SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void> *)
                 &this->missingInputKeys);
      (*pBVar6->_vptr_BuildSystemDelegate[0x10])
                (pBVar6,this,local_278,result.stringValues.size,local_90);
      pBVar6 = BuildSystem::getDelegate(system);
      (*pBVar6->_vptr_BuildSystemDelegate[6])();
    }
    __args = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue(&this->skipValue);
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,__args);
  }
  else {
    bVar1 = llvm::SmallVectorBase::empty((SmallVectorBase *)&this->missingInputKeys);
    if (!bVar1) {
      __assert_fail("missingInputKeys.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                    ,0x189,
                    "virtual void llbuild::buildsystem::ExternalCommand::execute(BuildSystem &, core::TaskInterface, QueueJobContext *, ResultFn)"
                   );
    }
    if (((this->canUpdateIfNewer & 1U) != 0) && ((this->hasPriorResult & 1U) != 0)) {
      pcVar8 = pcVar9;
      (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1b])
                (local_108,this,system,pcVar9,pcVar7);
      bVar1 = canUpdateIfNewerWithResult(this,(BuildValue *)local_108);
      if (bVar1) {
        std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()
                  (resultFn,(BuildValue *)local_108);
      }
      BuildValue::~BuildValue((BuildValue *)local_108);
      if (bVar1) {
        return;
      }
    }
    this_00 = &(this->super_Command).outputs;
    __end1 = std::
             vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ::begin(this_00);
    node = (BuildNode *)
           std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                       *)&node), bVar1) {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                ::operator*(&__end1);
      parent.Length = (size_t)*ppBVar3;
      bVar1 = BuildNode::isVirtual((BuildNode *)parent.Length);
      style = (Style)pcVar8;
      if (!bVar1) {
        local_160 = Node::getName((Node *)parent.Length);
        path.Length = 2;
        path.Data = (char *)local_160.Length;
        _local_150 = llvm::sys::path::parent_path((path *)local_160.Data,path,style);
        local_170 = Node::getName((Node *)parent.Length);
        local_180 = "/";
        __n = (char *)strlen("/");
        bVar1 = false;
        pcVar8 = (char *)local_170.Length;
        if (__n <= local_170.Length) {
          pcVar4 = llvm::StringRef::end(&local_170);
          if (__n == (char *)0x0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(pcVar4 + -(long)__n,local_180,(size_t)__n);
          }
          bVar1 = local_c == 0;
          pcVar8 = local_180;
        }
        if (bVar1) {
          local_1a0 = (path *)local_150;
          local_198 = parent.Data;
          path_00.Length = 2;
          path_00.Data = parent.Data;
          local_190 = llvm::sys::path::parent_path((path *)local_150,path_00,(Style)pcVar8);
          _local_150 = local_190;
        }
        if (parent.Data != (char *)0x0) {
          pFVar5 = BuildSystem::getFileSystem(system);
          llvm::StringRef::operator_cast_to_string(&local_1c0,(StringRef *)local_150);
          (*pFVar5->_vptr_FileSystem[3])(pFVar5,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
      }
      __gnu_cxx::
      __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
      ::operator++(&__end1);
    }
    pBVar6 = BuildSystem::getDelegate(system);
    (*pBVar6->_vptr_BuildSystemDelegate[10])(pBVar6,this);
    local_258.this = this;
    local_258.system = system;
    local_258.ti.impl = pcVar9;
    local_258.ti.ctx = pcVar7;
    local_1d0 = pcVar9;
    local_1c8 = pcVar7;
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::function
              (&local_258.resultFn,resultFn);
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ExternalCommand::execute(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::function<void(llbuild::buildsystem::BuildValue&&)>)::__0,void>
              ((function<void(llbuild::basic::ProcessResult)> *)&local_218,&local_258);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_1f8,&local_218);
    (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1a])
              (this,system,local_1d0,local_1c8,context,&local_1f8);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_1f8);
    std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_218);
    execute(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::function<void(llbuild::buildsystem::BuildValue&&)>)
    ::$_0::~__0((__0 *)&local_258);
  }
  return;
}

Assistant:

void ExternalCommand::execute(BuildSystem& system,
                              core::TaskInterface ti,
                              QueueJobContext* context,
                              ResultFn resultFn) {
  // If this command should be skipped, do nothing.
  if (skipValue.hasValue()) {
    // If this command had a failed input, treat it as having failed.
    if (!missingInputKeys.empty()) {
      system.getDelegate().commandCannotBuildOutputDueToMissingInputs(this,
                         outputs.empty() ? nullptr : outputs[0], missingInputKeys);

      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }

    resultFn(std::move(skipValue.getValue()));
    return;
  }
  assert(missingInputKeys.empty());

  // If it is legal to simply update the command, then see if we can do so.
  if (canUpdateIfNewer && hasPriorResult) {
    BuildValue result = computeCommandResult(system, ti);
    if (canUpdateIfNewerWithResult(result)) {
      resultFn(std::move(result));
      return;
    }
  }

  // Create the directories for the directories containing file outputs.
  //
  // FIXME: Implement a shared cache for this, to reduce the number of
  // syscalls required to make this happen.
  for (auto* node: outputs) {
    if (!node->isVirtual()) {
      // Attempt to create the directory; we ignore errors here under the
      // assumption the command will diagnose the situation if necessary.
      //
      // FIXME: Need to use the filesystem interfaces.
      auto parent = llvm::sys::path::parent_path(node->getName());
      if (node->getName().endswith("/")) {
        parent = llvm::sys::path::parent_path(parent);
      }
      if (!parent.empty()) {
        (void) system.getFileSystem().createDirectories(parent);
      }
    }
  }
    
  // Invoke the external command.
  system.getDelegate().commandStarted(this);
  executeExternalCommand(system, ti, context, {[this, &system, ti, resultFn](ProcessResult result) mutable {
    system.getDelegate().commandFinished(this, result.status);

    // Process the result.
    switch (result.status) {
    case ProcessStatus::Failed:
      resultFn(BuildValue::makeFailedCommand());
      return;
    case ProcessStatus::Cancelled:
      resultFn(BuildValue::makeCancelledCommand());
      return;
    case ProcessStatus::Succeeded:
      resultFn(computeCommandResult(system, ti));
      return;
    case ProcessStatus::Skipped:
    case ProcessStatus::Unknown:
      // It is illegal to get skipped result at this point.
      break;
    }
    llvm::report_fatal_error("unknown result");
  }});
}